

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udataswp.cpp
# Opt level: O0

int32_t uprv_copyArray32(UDataSwapper *ds,void *inData,int32_t length,void *outData,
                        UErrorCode *pErrorCode)

{
  UBool UVar1;
  UErrorCode *pErrorCode_local;
  void *outData_local;
  int32_t length_local;
  void *inData_local;
  UDataSwapper *ds_local;
  
  if ((pErrorCode == (UErrorCode *)0x0) || (UVar1 = U_FAILURE(*pErrorCode), UVar1 != '\0')) {
    ds_local._4_4_ = 0;
  }
  else if (((ds == (UDataSwapper *)0x0) ||
           (((inData == (void *)0x0 || (length < 0)) || ((length & 3U) != 0)))) ||
          (outData == (void *)0x0)) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    ds_local._4_4_ = 0;
  }
  else {
    ds_local._4_4_ = length;
    if ((0 < length) && (inData != outData)) {
      memcpy(outData,inData,(long)length);
    }
  }
  return ds_local._4_4_;
}

Assistant:

static int32_t U_CALLCONV
uprv_copyArray32(const UDataSwapper *ds,
                 const void *inData, int32_t length, void *outData,
                 UErrorCode *pErrorCode) {
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(ds==NULL || inData==NULL || length<0 || (length&3)!=0 || outData==NULL) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    if(length>0 && inData!=outData) {
        uprv_memcpy(outData, inData, length);
    }
    return length;
}